

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O0

void JsrtRuntime::RecyclerCollectCallbackStatic(void *context,RecyclerCollectCallBackFlags flags)

{
  ThreadContext *pTVar1;
  undefined1 local_58 [8];
  JsrtCallbackState scope_1;
  JsrtRuntime *_this_1;
  undefined1 local_30 [8];
  JsrtCallbackState scope;
  JsrtRuntime *_this;
  RecyclerCollectCallBackFlags flags_local;
  void *context_local;
  
  if ((flags & Collect_Begin) == 0) {
    if (((flags & Collect_Begin_Sweep) != 0) && (*(long *)((long)context + 0x28) != 0)) {
      scope_1.originalJsrtContext = (JsrtContext *)context;
      pTVar1 = GetThreadContext((JsrtRuntime *)context);
      JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_58,pTVar1);
      (*(code *)((scope_1.originalJsrtContext)->next).ptr)
                (scope_1.originalJsrtContext[1].super_FinalizableObject.super_IRecyclerVisitedObject
                 ._vptr_IRecyclerVisitedObject);
      JsrtCallbackState::~JsrtCallbackState((JsrtCallbackState *)local_58);
    }
  }
  else if (*(long *)((long)context + 0x20) != 0) {
    scope.originalJsrtContext = (JsrtContext *)context;
    pTVar1 = GetThreadContext((JsrtRuntime *)context);
    JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_30,pTVar1);
    (*(code *)((scope.originalJsrtContext)->previous).ptr)(scope.originalJsrtContext[1].next.ptr);
    JsrtCallbackState::~JsrtCallbackState((JsrtCallbackState *)local_30);
  }
  return;
}

Assistant:

void JsrtRuntime::RecyclerCollectCallbackStatic(void * context, RecyclerCollectCallBackFlags flags)
{
    if (flags & Collect_Begin)
    {
        JsrtRuntime * _this = reinterpret_cast<JsrtRuntime *>(context);
        if (_this->beforeCollectCallback == nullptr) 
        {
            return;
        }
        try
        {
            JsrtCallbackState scope(reinterpret_cast<ThreadContext*>(_this->GetThreadContext()));
            _this->beforeCollectCallback(_this->beforeCollectCallbackContext);
        }
        catch (...)
        {
            AssertMsg(false, "Unexpected non-engine exception.");
        }
    }
#ifdef _CHAKRACOREBUILD
    else if (flags & Collect_Begin_Sweep)
    {
        JsrtRuntime * _this = reinterpret_cast<JsrtRuntime *>(context);
        if (_this->beforeSweepCallback == nullptr)
        {
            return;
        }
        try
        {
            JsrtCallbackState scope(reinterpret_cast<ThreadContext*>(_this->GetThreadContext()));
            _this->beforeSweepCallback(_this->beforeSweepCallbackContext);
        }
        catch (...)
        {
            AssertMsg(false, "Unexpected non-engine exception.");
        }
    }
#endif
}